

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O2

bool mg::data::mzx_compress(string *raw,string *out,bool invert)

{
  byte *pbVar1;
  size_type sVar2;
  ulong uVar3;
  ulong __n;
  size_type pos;
  ulong uVar4;
  size_type i;
  ulong uVar5;
  
  sVar2 = raw->_M_string_length;
  std::__cxx11::string::resize((ulong)out);
  *(size_type *)(out->_M_dataplus)._M_p = sVar2 << 0x20 | 0x30585a4d;
  uVar3 = 8;
  for (uVar4 = 0; __n = raw->_M_string_length - uVar4, uVar4 <= raw->_M_string_length && __n != 0;
      uVar4 = uVar4 + __n) {
    if (0x7f < __n) {
      __n = 0x80;
    }
    uVar5 = uVar3 + 1;
    (out->_M_dataplus)._M_p[uVar3] =
         (((byte)__n & 1) + ((byte)((__n & 0xffffffff) >> 1) & 0x7f)) * '\x04' + -1;
    memcpy((out->_M_dataplus)._M_p + uVar5,(raw->_M_dataplus)._M_p + uVar4,__n);
    uVar3 = uVar3 + __n + 1;
    if (invert) {
      for (; uVar5 < uVar3; uVar5 = uVar5 + 1) {
        pbVar1 = (byte *)((out->_M_dataplus)._M_p + uVar5);
        *pbVar1 = ~*pbVar1;
      }
    }
  }
  std::__cxx11::string::resize((ulong)out);
  return true;
}

Assistant:

bool mzx_compress(const std::string &raw, std::string &out, bool invert) {
  // Don't bother actually compressing the data for now, just emit a valid
  // stream of literals
  MzxHeader header;
  memcpy(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic));
  header.decompressed_size = raw.size();

  // Estimate our final size
  const std::string::size_type output_size =
      sizeof(header) + raw.size() + 2 * ((raw.size() / 128) + 1);
  out.resize(output_size);

  // Write header
  std::string::size_type output_offset = 0;
  header.to_file_order();
  memcpy(out.data(), &header, sizeof(header));
  output_offset += sizeof(header);

  for (std::string::size_type pos = 0; pos < raw.size();) {
    // Len field is 6 bits, each word is 2 bytes, we can write 128 bytes per
    // literal record
    const std::string::size_type bytes_remaining = raw.size() - pos;
    const unsigned bytes_to_write =
        bytes_remaining < 128 ? bytes_remaining : 128;

    // Convert that to a number of words to write.
    // If we have a trailing byte, that needs an extra word.
    uint8_t words_to_write = bytes_to_write / 2;
    if (bytes_to_write & 1) {
      words_to_write++;
    }

    // The number of words to write offset by one in the literal
    words_to_write--;

    // Pack the cmd
    uint8_t cmd = CMD_LITERAL | (words_to_write << 2);
    out[output_offset++] = cmd;

    // Write the next bytes_to_write datums
    memcpy(&out[output_offset], &raw[pos], bytes_to_write);
    if (invert) {
      for (std::string::size_type i = output_offset;
           i < output_offset + bytes_to_write; i++) {
        out[i] ^= 0xFF;
      }
    }
    output_offset += bytes_to_write;

    // Increment pos
    pos += bytes_to_write;
  }

  // Shrink the output size down to the bytes we actually wrote
  out.resize(output_offset);

  return true;
}